

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall ktx::ValidationContext::validatePaddings(ValidationContext *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t offset;
  size_t size;
  bool bVar4;
  char cVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  ulong __val;
  pointer pkVar9;
  char cVar10;
  string __str;
  anon_class_16_2_1291d6ae check;
  size_t position;
  long *local_100;
  uint local_f8;
  long local_f0 [2];
  string local_e0;
  ktx_uint64_t local_c0;
  ktx_uint64_t local_b8;
  ulong local_b0;
  anon_class_16_2_1291d6ae local_a8;
  string local_98;
  string local_78;
  string local_58;
  size_t local_38;
  
  uVar1 = (this->header).dataFormatDescriptor.byteOffset;
  uVar2 = (this->header).dataFormatDescriptor.byteLength;
  local_b0 = (ulong)(this->header).keyValueData.byteOffset;
  uVar3 = (this->header).keyValueData.byteLength;
  local_b8 = (this->header).supercompressionGlobalData.byteOffset;
  local_c0 = (this->header).supercompressionGlobalData.byteLength;
  local_38 = (ulong)this->numLevels * 0x18 + 0x50;
  local_a8.position = &local_38;
  local_a8.this = this;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"DFD","");
  validatePaddings::anon_class_16_2_1291d6ae::operator()
            (&local_a8,(ulong)uVar1,(ulong)uVar2,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"KVD","");
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&local_a8,local_b0,(ulong)uVar3,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"SGD","");
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&local_a8,local_b8,local_c0,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pkVar9 = (this->levelIndices).
           super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pkVar9 != (this->levelIndices).
                super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
                super__Vector_impl_data._M_start) {
    __val = ((long)pkVar9 -
             (long)(this->levelIndices).
                   super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    do {
      __val = __val - 1;
      cVar10 = '\x01';
      if (9 < __val) {
        uVar7 = __val;
        cVar5 = '\x04';
        do {
          cVar10 = cVar5;
          if (uVar7 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_001ac149;
          }
          if (uVar7 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_001ac149;
          }
          if (uVar7 < 10000) goto LAB_001ac149;
          bVar4 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar5 = cVar10 + '\x04';
        } while (bVar4);
        cVar10 = cVar10 + '\x01';
      }
LAB_001ac149:
      offset = pkVar9[-1].byteOffset;
      size = pkVar9[-1].byteLength;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct((ulong)&local_100,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_100,local_f8,__val);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x212730);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e0.field_2._M_allocated_capacity = *psVar8;
        local_e0.field_2._8_8_ = plVar6[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar8;
        local_e0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_e0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      validatePaddings::anon_class_16_2_1291d6ae::operator()(&local_a8,offset,size,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
      pkVar9 = pkVar9 + -1;
    } while (pkVar9 != (this->levelIndices).
                       super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ValidationContext::validatePaddings() {
    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    size_t position = levelIndexOffset + levelIndexSize;
    const auto check = [&](size_t offset, size_t size, std::string name) {
        if (offset == 0 || size == 0)
            return; // Block is missing, skip

        if (offset < position) {
            position = std::max(position, offset + size);
            return; // Just ignore invalid block placements regarding padding checks
        }

        const auto paddingSize = offset - position;
        const auto buffer = std::make_unique<uint8_t[]>(paddingSize);
        read(position, buffer.get(), paddingSize, "the padding before " + name);

        for (size_t i = 0; i < paddingSize; ++i)
            if (buffer[i] != 0) {
                error(Metadata::PaddingNotZero, buffer[i], fmt::format("before {} at offset {}", name, position + i));
                break; // Only report the first non-zero byte per padding, no need to spam
            }

        position = offset + size;
    };

    check(dfdByteOffset, dfdByteLength, "DFD");
    check(kvdByteOffset, kvdByteLength, "KVD");
    check(sgdByteOffset, sgdByteLength, "SGD");
    size_t i = levelIndices.size() - 1;
    for (auto it = levelIndices.rbegin(); it != levelIndices.rend(); ++it)
        check(it->byteOffset, it->byteLength, "image level " + std::to_string(i--));
}